

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_fsetstat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen handle,fxp_attrs attrs)

{
  int iVar1;
  undefined1 local_58 [8];
  timeval tv [2];
  _Bool success;
  int fd;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen handle_local;
  
  tv[1].tv_usec._4_4_ = uss_lookup_fd((UnixSftpServer *)(srv + -6),reply,handle);
  if (-1 < tv[1].tv_usec._4_4_) {
    tv[1].tv_usec._3_1_ = 1;
    if (((undefined1  [56])attrs & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      iVar1 = ftruncate(tv[1].tv_usec._4_4_,attrs.size);
      if (iVar1 < 0) {
        tv[1].tv_usec._3_1_ = 0;
      }
    }
    if ((((undefined1  [56])attrs & (undefined1  [56])0x2) != (undefined1  [56])0x0) &&
       (iVar1 = fchown(tv[1].tv_usec._4_4_,(__uid_t)attrs.uid,(__gid_t)attrs.gid), iVar1 < 0)) {
      tv[1].tv_usec._3_1_ = 0;
    }
    if ((((undefined1  [56])attrs & (undefined1  [56])0x4) != (undefined1  [56])0x0) &&
       (iVar1 = fchmod(tv[1].tv_usec._4_4_,(__mode_t)attrs.permissions), iVar1 < 0)) {
      tv[1].tv_usec._3_1_ = 0;
    }
    if (((undefined1  [56])attrs & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      local_58 = (undefined1  [8])attrs.atime;
      tv[0].tv_usec = attrs.mtime;
      tv[1].tv_sec = 0;
      tv[0].tv_sec = 0;
      iVar1 = futimes(tv[1].tv_usec._4_4_,(timeval *)local_58);
      if (iVar1 < 0) {
        tv[1].tv_usec._3_1_ = 0;
      }
    }
    if ((tv[1].tv_usec._3_1_ & 1) == 0) {
      uss_error((UnixSftpServer *)(srv + -6),reply);
    }
    else {
      fxp_reply_ok(reply);
    }
  }
  return;
}

Assistant:

static void uss_fsetstat(SftpServer *srv, SftpReplyBuilder *reply,
                         ptrlen handle, struct fxp_attrs attrs)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    int fd;

    if ((fd = uss_lookup_fd(uss, reply, handle)) < 0)
        return;

    bool success = true;
    SETSTAT_GUTS(FD_PREFIX, fd, attrs, success);

    if (!success) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}